

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
flow::convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,flow *this,
          vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  long lVar1;
  pointer plVar2;
  long lVar3;
  long lVar4;
  allocator_type local_11;
  
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,*(long *)(this + 8) - *(long *)this >> 3,&local_11);
  lVar1 = *(long *)this;
  lVar3 = *(long *)(this + 8) - lVar1;
  if (lVar3 != 0) {
    plVar2 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      plVar2[lVar4] = *(long *)(*(long *)(lVar1 + lVar4 * 8) + 0x48);
      lVar4 = lVar4 + 1;
    } while (lVar3 >> 3 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}